

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::(anonymous_namespace)::
     ArrayValueToVertexAttribute<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
               (Value *value,string *name,uint32_t elementSize,VertexVariability variability,
               uint32_t num_vertices,uint32_t num_face_counts,uint32_t num_face_vertex_indices,
               VertexAttributeFormat format,VertexAttribute *dst,string *err)

{
  ostream *poVar1;
  size_t sVar2;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *this;
  uchar *__dest;
  matrix2d *__src;
  undefined4 in_register_00000084;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined4 in_register_0000008c;
  string local_1278 [32];
  string local_1258;
  string local_1238;
  allocator local_1211;
  string local_1210 [32];
  string local_11f0;
  ostringstream local_11d0 [8];
  ostringstream ss_e_9;
  string local_1058 [39];
  allocator local_1031;
  string local_1030;
  string local_1010;
  ostringstream local_ff0 [8];
  ostringstream ss_e_8;
  string local_e78 [32];
  undefined1 local_e58 [8];
  string local_e50 [32];
  string local_e30;
  ostringstream local_e10 [8];
  ostringstream ss_e_7;
  string local_c98 [32];
  undefined1 local_c78 [8];
  string local_c70 [32];
  string local_c50;
  ostringstream local_c30 [8];
  ostringstream ss_e_6;
  string local_ab8 [32];
  undefined1 local_a98 [8];
  string local_a90 [32];
  string local_a70;
  ostringstream local_a50 [8];
  ostringstream ss_e_5;
  string local_8d8 [32];
  undefined1 local_8b8 [8];
  string local_8b0 [32];
  string local_890;
  ostringstream local_870 [8];
  ostringstream ss_e_4;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [32];
  string local_6b0;
  ostringstream local_690 [8];
  ostringstream ss_e_3;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *pv;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *p;
  ostringstream local_4e8 [8];
  ostringstream ss_e_2;
  string local_370 [32];
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  size_t local_40;
  size_t value_counts;
  size_t baseTySize;
  uint32_t num_face_counts_local;
  uint32_t num_vertices_local;
  VertexVariability variability_local;
  uint32_t elementSize_local;
  string *name_local;
  Value *value_local;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_00000084,num_vertices);
  baseTySize._0_4_ = num_face_counts;
  baseTySize._4_4_ = num_vertices;
  num_face_counts_local = variability;
  num_vertices_local = elementSize;
  _variability_local = name;
  name_local = (string *)value;
  value_counts = tinyusdz::value::
                 TypeTraits<std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>_>
                 ::size();
  local_40 = tinyusdz::value::Value::array_size((Value *)name_local);
  if (local_40 == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar1 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
    poVar1 = ::std::operator<<(poVar1,"():");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4b5);
    ::std::operator<<(poVar1," ");
    poVar1 = ::std::operator<<((ostream *)local_1b8,"Empty array size");
    ::std::operator<<(poVar1,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1d8);
      ::std::__cxx11::string::~string(local_1d8);
    }
    value_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else if (num_face_counts_local == 5) {
    ::std::__cxx11::ostringstream::ostringstream(local_350);
    poVar1 = ::std::operator<<((ostream *)local_350,"[error]");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
    poVar1 = ::std::operator<<(poVar1,"():");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4b9);
    ::std::operator<<(poVar1," ");
    poVar1 = ::std::operator<<((ostream *)local_350,"Indexed variability is not supported.");
    ::std::operator<<(poVar1,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_370);
      ::std::__cxx11::string::~string(local_370);
    }
    value_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_350);
  }
  else {
    sVar2 = VertexAttributeFormatSize(format);
    if (sVar2 == value_counts) {
      tinyusdz::value::Value::
      as<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                ((Value *)name_local,false);
      this = tinyusdz::value::Value::
             as<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                       ((Value *)name_local,false);
      if (this == (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                  0x0) {
        ::std::__cxx11::ostringstream::ostringstream(local_11d0);
        poVar1 = ::std::operator<<((ostream *)local_11d0,"[error]");
        poVar1 = ::std::operator<<(poVar1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar1 = ::std::operator<<(poVar1,":");
        poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
        poVar1 = ::std::operator<<(poVar1,"():");
        poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x50a);
        ::std::operator<<(poVar1," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1210,
                   "Requested underlying type {} but input `value` has underlying type {}.",
                   &local_1211);
        tinyusdz::value::
        TypeTraits<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
        ::type_name_abi_cxx11_();
        tinyusdz::value::Value::underlying_type_name_abi_cxx11_(&local_1258,(Value *)name_local);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_11f0,(fmt *)local_1210,&local_1238,&local_1258,args_1);
        poVar1 = ::std::operator<<((ostream *)local_11d0,(string *)&local_11f0);
        ::std::operator<<(poVar1,"\n");
        ::std::__cxx11::string::~string((string *)&local_11f0);
        ::std::__cxx11::string::~string((string *)&local_1258);
        ::std::__cxx11::string::~string((string *)&local_1238);
        ::std::__cxx11::string::~string(local_1210);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1211);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_1278);
          ::std::__cxx11::string::~string(local_1278);
        }
        value_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_11d0);
      }
      else {
        switch(num_face_counts_local) {
        case 0:
          if (local_40 != num_vertices_local) {
            ::std::__cxx11::ostringstream::ostringstream(local_690);
            poVar1 = ::std::operator<<((ostream *)local_690,"[error]");
            poVar1 = ::std::operator<<(poVar1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar1 = ::std::operator<<(poVar1,":");
            poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
            poVar1 = ::std::operator<<(poVar1,"():");
            poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4d0);
            ::std::operator<<(poVar1," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_6d0,"{} # of items {} expected, but got {}. Variability = Constant",
                       &local_6d1);
            fmt::format<std::__cxx11::string,unsigned_int,unsigned_long>
                      (&local_6b0,(fmt *)local_6d0,_variability_local,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &num_vertices_local,(uint *)&local_40,
                       (unsigned_long *)CONCAT44(in_register_0000008c,num_face_counts));
            poVar1 = ::std::operator<<((ostream *)local_690,(string *)&local_6b0);
            ::std::operator<<(poVar1,"\n");
            ::std::__cxx11::string::~string((string *)&local_6b0);
            ::std::__cxx11::string::~string(local_6d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_6f8);
              ::std::__cxx11::string::~string(local_6f8);
            }
            value_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_690);
            goto LAB_004fbc45;
          }
          break;
        case 1:
          if (local_40 != num_vertices_local * (uint32_t)baseTySize) {
            ::std::__cxx11::ostringstream::ostringstream(local_870);
            poVar1 = ::std::operator<<((ostream *)local_870,"[error]");
            poVar1 = ::std::operator<<(poVar1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar1 = ::std::operator<<(poVar1,":");
            poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
            poVar1 = ::std::operator<<(poVar1,"():");
            poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4d8);
            ::std::operator<<(poVar1," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_8b0,"{} # of items {} expected, but got {}. Variability = Uniform",
                       (allocator *)(local_8b8 + 7));
            local_8b8._0_4_ = num_vertices_local * (uint32_t)baseTySize;
            fmt::format<std::__cxx11::string,unsigned_int,unsigned_long>
                      (&local_890,(fmt *)local_8b0,_variability_local,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8b8,(uint *)&local_40,
                       (unsigned_long *)CONCAT44(in_register_0000008c,num_face_counts));
            poVar1 = ::std::operator<<((ostream *)local_870,(string *)&local_890);
            ::std::operator<<(poVar1,"\n");
            ::std::__cxx11::string::~string((string *)&local_890);
            ::std::__cxx11::string::~string(local_8b0);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_8b8 + 7));
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_8d8);
              ::std::__cxx11::string::~string(local_8d8);
            }
            value_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_870);
            goto LAB_004fbc45;
          }
          break;
        case 2:
          if (local_40 != num_vertices_local * baseTySize._4_4_) {
            ::std::__cxx11::ostringstream::ostringstream(local_c30);
            poVar1 = ::std::operator<<((ostream *)local_c30,"[error]");
            poVar1 = ::std::operator<<(poVar1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar1 = ::std::operator<<(poVar1,":");
            poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
            poVar1 = ::std::operator<<(poVar1,"():");
            poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4e7);
            ::std::operator<<(poVar1," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_c70,"{} # of items {} expected, but got {}. Variability = Varying",
                       (allocator *)(local_c78 + 7));
            local_c78._0_4_ = num_vertices_local * baseTySize._4_4_;
            fmt::format<std::__cxx11::string,unsigned_int,unsigned_long>
                      (&local_c50,(fmt *)local_c70,_variability_local,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c78,(uint *)&local_40,
                       (unsigned_long *)CONCAT44(in_register_0000008c,num_face_counts));
            poVar1 = ::std::operator<<((ostream *)local_c30,(string *)&local_c50);
            ::std::operator<<(poVar1,"\n");
            ::std::__cxx11::string::~string((string *)&local_c50);
            ::std::__cxx11::string::~string(local_c70);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_c78 + 7));
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_c98);
              ::std::__cxx11::string::~string(local_c98);
            }
            value_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_c30);
            goto LAB_004fbc45;
          }
          break;
        case 3:
          if (local_40 != num_vertices_local * baseTySize._4_4_) {
            ::std::__cxx11::ostringstream::ostringstream(local_a50);
            poVar1 = ::std::operator<<((ostream *)local_a50,"[error]");
            poVar1 = ::std::operator<<(poVar1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar1 = ::std::operator<<(poVar1,":");
            poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
            poVar1 = ::std::operator<<(poVar1,"():");
            poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4e0);
            ::std::operator<<(poVar1," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_a90,"{} # of items {} expected, but got {}. Variability = Vertex",
                       (allocator *)(local_a98 + 7));
            local_a98._0_4_ = num_vertices_local * baseTySize._4_4_;
            fmt::format<std::__cxx11::string,unsigned_int,unsigned_long>
                      (&local_a70,(fmt *)local_a90,_variability_local,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a98,(uint *)&local_40,
                       (unsigned_long *)CONCAT44(in_register_0000008c,num_face_counts));
            poVar1 = ::std::operator<<((ostream *)local_a50,(string *)&local_a70);
            ::std::operator<<(poVar1,"\n");
            ::std::__cxx11::string::~string((string *)&local_a70);
            ::std::__cxx11::string::~string(local_a90);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_a98 + 7));
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_ab8);
              ::std::__cxx11::string::~string(local_ab8);
            }
            value_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_a50);
            goto LAB_004fbc45;
          }
          break;
        case 4:
          if (local_40 != num_vertices_local * num_face_vertex_indices) {
            ::std::__cxx11::ostringstream::ostringstream(local_e10);
            poVar1 = ::std::operator<<((ostream *)local_e10,"[error]");
            poVar1 = ::std::operator<<(poVar1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar1 = ::std::operator<<(poVar1,":");
            poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
            poVar1 = ::std::operator<<(poVar1,"():");
            poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4ef);
            ::std::operator<<(poVar1," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_e50,"# of items {} expected, but got {}. Variability = FaceVarying",
                       (allocator *)(local_e58 + 7));
            local_e58._0_4_ = num_vertices_local * num_face_vertex_indices;
            fmt::format<unsigned_int,unsigned_long>
                      (&local_e30,(fmt *)local_e50,(string *)local_e58,(uint *)&local_40,
                       (unsigned_long *)args_1);
            poVar1 = ::std::operator<<((ostream *)local_e10,(string *)&local_e30);
            ::std::operator<<(poVar1,"\n");
            ::std::__cxx11::string::~string((string *)&local_e30);
            ::std::__cxx11::string::~string(local_e50);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_e58 + 7));
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_e78);
              ::std::__cxx11::string::~string(local_e78);
            }
            value_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_e10);
            goto LAB_004fbc45;
          }
          break;
        case 5:
          ::std::__cxx11::ostringstream::ostringstream(local_ff0);
          poVar1 = ::std::operator<<((ostream *)local_ff0,"[error]");
          poVar1 = ::std::operator<<(poVar1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                    );
          poVar1 = ::std::operator<<(poVar1,":");
          poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
          poVar1 = ::std::operator<<(poVar1,"():");
          poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4f5);
          ::std::operator<<(poVar1," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_1030,
                     "{} Internal error. \'Indexed\' variability is not supported.",&local_1031);
          fmt::format(&local_1010,&local_1030);
          poVar1 = ::std::operator<<((ostream *)local_ff0,(string *)&local_1010);
          ::std::operator<<(poVar1,"\n");
          ::std::__cxx11::string::~string((string *)&local_1010);
          ::std::__cxx11::string::~string((string *)&local_1030);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1031);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,local_1058);
            ::std::__cxx11::string::~string(local_1058);
          }
          value_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_ff0);
          goto LAB_004fbc45;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                   local_40 * value_counts);
        __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
        __src = ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                ::data(this);
        memcpy(__dest,__src,local_40 * value_counts);
        dst->elementSize = num_vertices_local;
        dst->stride = 0;
        dst->format = format;
        dst->variability = num_face_counts_local;
        ::std::__cxx11::string::operator=((string *)dst,(string *)_variability_local);
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&dst->indices);
        value_local._7_1_ = 1;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_4e8);
      poVar1 = ::std::operator<<((ostream *)local_4e8,"[error]");
      poVar1 = ::std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar1 = ::std::operator<<(poVar1,":");
      poVar1 = ::std::operator<<(poVar1,"ArrayValueToVertexAttribute");
      poVar1 = ::std::operator<<(poVar1,"():");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4bf);
      ::std::operator<<(poVar1," ");
      poVar1 = ::std::operator<<((ostream *)local_4e8,"format size mismatch. expected ");
      sVar2 = VertexAttributeFormatSize(format);
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,sVar2);
      poVar1 = ::std::operator<<(poVar1," but got ");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,value_counts);
      ::std::operator<<(poVar1,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,(string *)&p);
        ::std::__cxx11::string::~string((string *)&p);
      }
      value_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
    }
  }
LAB_004fbc45:
  return (bool)(value_local._7_1_ & 1);
}

Assistant:

bool ArrayValueToVertexAttribute(
    const value::Value &value, const std::string &name,
    const uint32_t elementSize, const VertexVariability variability,
    const uint32_t num_vertices, const uint32_t num_face_counts,
    const uint32_t num_face_vertex_indices, const VertexAttributeFormat format,
    VertexAttribute &dst, std::string *err) {
  if (!value::TypeTraits<UnderlyingTy>::is_array()) {
    PUSH_ERROR_AND_RETURN(
        "[Internal error] UnderlyingTy template parameter must be array type.");
  }

  size_t baseTySize = value::TypeTraits<UnderlyingTy>::size();

  size_t value_counts = value.array_size();
  if (value_counts == 0) {
    PUSH_ERROR_AND_RETURN("Empty array size");
  }

  if (variability == VertexVariability::Indexed) {
    PUSH_ERROR_AND_RETURN("Indexed variability is not supported.");
  }

  if (VertexAttributeFormatSize(format) != baseTySize) {
    PUSH_ERROR_AND_RETURN("format size mismatch. expected "
                          << VertexAttributeFormatSize(format) << " but got "
                          << baseTySize);
    return false;
  }

  DCOUT("value.type = " << value.type_name());
  DCOUT("UnderlyingTy = " << value::TypeTraits<UnderlyingTy>::type_name());
  const auto p = value.as<UnderlyingTy>();
  if (!p) {
    DCOUT("p is nullptr");
  }

  if (auto pv = value.as<UnderlyingTy>()) {
    switch (variability) {
    case VertexVariability::Constant: {
      if (value_counts != elementSize) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Constant",
            name, elementSize, value_counts));
      }
      break;
    }
    case VertexVariability::Uniform: {
      if (value_counts != (elementSize * num_face_counts)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Uniform",
            name, elementSize * num_face_counts, value_counts));
      }
      break;
    }
    case VertexVariability::Vertex: {
      if (value_counts != (elementSize * num_vertices)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Vertex",
            name, elementSize * num_vertices, value_counts));
      }
      break;
    case VertexVariability::Varying: {
      if (value_counts != (elementSize * num_vertices)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "{} # of items {} expected, but got {}. Variability = Varying",
            name, elementSize * num_vertices, value_counts));
      }
      break;
    }
    case VertexVariability::FaceVarying: {
      if (value_counts != (elementSize * num_face_vertex_indices)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "# of items {} expected, but got {}. Variability = FaceVarying",
            elementSize * num_face_vertex_indices, value_counts));
      }
      break;
    }
    case VertexVariability::Indexed: {
      PUSH_ERROR_AND_RETURN(fmt::format(
            "{} Internal error. 'Indexed' variability is not supported."));
      }
      break;
    }
    }

    dst.data.resize(value_counts * baseTySize);
    memcpy(dst.data.data(), pv->data(), value_counts * baseTySize);

    dst.elementSize = elementSize;
    dst.stride = 0;
    dst.format = format;
    dst.variability = variability;
    dst.name = name;
    dst.indices.clear();
    return true;
  }

  PUSH_ERROR_AND_RETURN(fmt::format(
      "Requested underlying type {} but input `value` has underlying type {}.",
      value::TypeTraits<UnderlyingTy>::type_name(),
      value.underlying_type_name()));
}